

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_t * ptls_client_new(ptls_context_t *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ptls_t *tls_00;
  ptls_log_conn_state_t *conn;
  ptls_iovec_t pVar3;
  int local_44;
  int ptlslog_include_appdata;
  ptls_log_conn_state_t *conn_state;
  ptls_t *_tls;
  uint8_t *puStack_28;
  uint32_t active;
  size_t local_20;
  ptls_t *tls;
  ptls_context_t *ctx_local;
  
  tls_00 = new_instance(ctx,0);
  tls_00->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
  (*tls_00->ctx->random_bytes)(tls_00->client_random,0x20);
  log_client_random(tls_00);
  if (((byte)tls_00->field_0x1e8 >> 2 & 1) != 0) {
    pVar3 = ptls_iovec_init((void *)((long)&tls_00->field_19 + 0x10),0x20);
    puStack_28 = pVar3.base;
    (tls_00->field_19).client.legacy_session_id.base = puStack_28;
    local_20 = pVar3.len;
    (tls_00->field_19).client.legacy_session_id.len = local_20;
    (*tls_00->ctx->random_bytes)
              ((tls_00->field_19).client.legacy_session_id.base,
               (tls_00->field_19).client.legacy_session_id.len);
  }
  uVar1 = ptls_log_point_maybe_active(&ptls_client_new::logpoint);
  if (uVar1 != 0) {
    conn = ptls_get_log_state(tls_00);
    uVar2 = ptls_log_conn_maybe_active(conn,ptls_get_server_name,tls_00);
    if ((uVar2 & uVar1) != 0) {
      local_44 = 0;
      do {
        ptls_log__do_write_start(&ptls_client_new::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls_00);
        ptls_log__do_push_element_bool(",\"is_server\":",0xd,0);
        local_44 = ptls_log__do_write_end
                             (&ptls_client_new::logpoint,conn,ptls_get_server_name,tls_00,local_44);
      } while (local_44 != 0);
    }
  }
  return tls_00;
}

Assistant:

ptls_t *ptls_client_new(ptls_context_t *ctx)
{
    ptls_t *tls = new_instance(ctx, 0);
    tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
    tls->ctx->random_bytes(tls->client_random, sizeof(tls->client_random));
    log_client_random(tls);
    if (tls->send_change_cipher_spec) {
        tls->client.legacy_session_id =
            ptls_iovec_init(tls->client.legacy_session_id_buf, sizeof(tls->client.legacy_session_id_buf));
        tls->ctx->random_bytes(tls->client.legacy_session_id.base, tls->client.legacy_session_id.len);
    }

    PTLS_PROBE(NEW, tls, 0);
    PTLS_LOG_CONN(new, tls, { PTLS_LOG_ELEMENT_BOOL(is_server, 0); });
    return tls;
}